

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.cpp
# Opt level: O0

StrT<char> * __thiscall tl::StrT<char>::operator=(StrT<char> *this,StrT<char> *o)

{
  type *o_00;
  StrT<char> *o_local;
  StrT<char> *this_local;
  
  if ((this->_str != &s_emptyStr<char>) && (this->_str != (char *)0x0)) {
    operator_delete__(this->_str);
  }
  o_00 = move<tl::StrT<char>&>(o);
  stealMove(this,o_00);
  return this;
}

Assistant:

const StrT<CharT>& StrT<CharT>::operator=(StrT&& o)
{
    if(_str != s_emptyStr<CharT>)
        delete[] _str;
    stealMove(tl::move(o));
    return *this;
}